

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

int SMCompatible_Sparse(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix_ID SVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  SVar1 = SUNMatGetID(A);
  uVar2 = 0;
  if (SVar1 == SUNMATRIX_SPARSE) {
    SVar1 = SUNMatGetID(B);
    if (SVar1 == SUNMATRIX_SPARSE) {
      SVar1 = SUNMatGetID(A);
      iVar3 = -0x2bd;
      iVar4 = -0x2bd;
      if (SVar1 == SUNMATRIX_SPARSE) {
        iVar4 = *A->content;
      }
      SVar1 = SUNMatGetID(B);
      if (SVar1 == SUNMATRIX_SPARSE) {
        iVar3 = *B->content;
      }
      if (iVar4 == iVar3) {
        SVar1 = SUNMatGetID(A);
        iVar3 = -0x2bd;
        iVar4 = -0x2bd;
        if (SVar1 == SUNMATRIX_SPARSE) {
          iVar4 = *(int *)((long)A->content + 4);
        }
        SVar1 = SUNMatGetID(B);
        if (SVar1 == SUNMATRIX_SPARSE) {
          iVar3 = *(int *)((long)B->content + 4);
        }
        uVar2 = 0;
        if (iVar4 == iVar3) {
          uVar2 = (uint)(*(int *)((long)A->content + 0x18) == *(int *)((long)B->content + 0x18));
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static booleantype SMCompatible_Sparse(SUNMatrix A, SUNMatrix B)
{
  /* both matrices must be sparse */
  if ( (SUNMatGetID(A) != SUNMATRIX_SPARSE) ||
       (SUNMatGetID(B) != SUNMATRIX_SPARSE) )
    return SUNFALSE;

  /* both matrices must have the same shape and sparsity type */
  if (SUNSparseMatrix_Rows(A) != SUNSparseMatrix_Rows(B))
    return SUNFALSE;
  if (SUNSparseMatrix_Columns(A) != SUNSparseMatrix_Columns(B))
    return SUNFALSE;
  if (SM_SPARSETYPE_S(A) != SM_SPARSETYPE_S(B))
    return SUNFALSE;

  return SUNTRUE;
}